

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O0

Value * cmFileAPIToolchainsDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  undefined1 local_30 [8];
  Toolchains toolchains;
  unsigned_long version_local;
  cmFileAPI *fileAPI_local;
  
  toolchains.Version = version;
  anon_unknown.dwarf_d9f85c::Toolchains::Toolchains((Toolchains *)local_30,fileAPI,version);
  anon_unknown.dwarf_d9f85c::Toolchains::Dump(__return_storage_ptr__,(Toolchains *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPIToolchainsDump(cmFileAPI& fileAPI, unsigned long version)
{
  Toolchains toolchains(fileAPI, version);
  return toolchains.Dump();
}